

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<int_*> * __thiscall TPZVec<int_*>::operator=(TPZVec<int_*> *this,TPZVec<int_*> *copy)

{
  long lVar1;
  long lVar2;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this,copy->fNElements);
    lVar1 = copy->fNElements;
    if (0 < lVar1) {
      lVar2 = 0;
      do {
        this->fStore[lVar2] = copy->fStore[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar1 != lVar2);
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}